

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Env * leveldb::Env::Default(void)

{
  int iVar1;
  Env *pEVar2;
  
  if (Default()::env_container == '\0') {
    iVar1 = __cxa_guard_acquire(&Default()::env_container);
    if (iVar1 != 0) {
      anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::SingletonEnv
                (&Default::env_container);
      __cxa_guard_release(&Default()::env_container);
    }
  }
  pEVar2 = anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::env
                     (&Default::env_container);
  return pEVar2;
}

Assistant:

Env* Env::Default() {
  static PosixDefaultEnv env_container;
  return env_container.env();
}